

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

int __thiscall
cmCTestSubmitHandler::HandleCDashUploadFile
          (cmCTestSubmitHandler *this,string *file,string *typeString)

{
  cmCTest *pcVar1;
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Int IVar5;
  ulong uVar6;
  string *psVar7;
  ostream *poVar8;
  cmCTestScriptHandler *pcVar9;
  cmValue source;
  long lVar10;
  long lVar11;
  long lVar12;
  Value *pVVar13;
  cmCTestSubmitHandler *pcVar14;
  string_view arg;
  string_view str_00;
  string_view str_01;
  string local_8f8;
  cmCTestSubmitHandler *local_8d8;
  allocator<char> local_8ca;
  allocator<char> local_8c9;
  unsigned_long local_8c8;
  unsigned_long retryCount;
  string response;
  string url;
  Value json;
  string fields;
  string local_818;
  string upload_as;
  ostringstream fstr;
  unsigned_long retryDelayValue;
  string retryCountString;
  string retryDelayString;
  cmCTestCurl curl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string md5sum;
  string curlopt;
  ostringstream str;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader reader;
  
  if (file->_M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    std::operator<<((ostream *)&str,"Upload file not specified\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x1ed,_fstr,false);
LAB_0019c3b6:
    std::__cxx11::string::~string((string *)&fstr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
    return -1;
  }
  bVar2 = cmsys::SystemTools::FileExists(file);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    poVar8 = std::operator<<((ostream *)&str,"Upload file not found: \'");
    poVar8 = std::operator<<(poVar8,(string *)file);
    std::operator<<(poVar8,"\'\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x1f2,_fstr,false);
    goto LAB_0019c3b6;
  }
  cmCTestCurl::cmCTestCurl(&curl,(this->super_cmCTestGenericHandler).CTest);
  curl.Quiet = (this->super_cmCTestGenericHandler).Quiet;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"CurlOptions",(allocator<char> *)&fstr);
  cmCTest::GetCTestConfiguration(&curlopt,pcVar1,(string *)&str);
  std::__cxx11::string::~string((string *)&str);
  arg._M_str = curlopt._M_dataplus._M_p;
  arg._M_len = curlopt._M_string_length;
  cmExpandedList_abi_cxx11_(&args,arg,false);
  cmCTestCurl::SetCurlOptions(&curl,&args);
  iVar4 = GetSubmitInactivityTimeout(this);
  if (iVar4 != 0) {
    curl.TimeOutSeconds = iVar4;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&curl.HttpHeaders,&this->HttpHeaders);
  cmCTest::GetSubmitURL_abi_cxx11_(&url,(this->super_cmCTestGenericHandler).CTest);
  str_00._M_str = url._M_dataplus._M_p;
  str_00._M_len = url._M_string_length;
  bVar2 = cmHasLiteralPrefix<8ul>(str_00,(char (*) [8])"http://");
  if ((!bVar2) &&
     (str_01._M_str = url._M_dataplus._M_p, str_01._M_len = url._M_string_length,
     bVar2 = cmHasLiteralPrefix<9ul>(str_01,(char (*) [9])"https://"), !bVar2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    std::operator<<((ostream *)&str,"Only http and https are supported for CDASH_UPLOAD\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x203,_fstr,false);
    std::__cxx11::string::~string((string *)&fstr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
    iVar4 = -1;
    goto LAB_0019d739;
  }
  fields._M_dataplus._M_p = (pointer)&fields.field_2;
  fields._M_string_length = 0;
  fields.field_2._M_local_buf[0] = '\0';
  uVar6 = std::__cxx11::string::find((char)&url,0x3f);
  if (uVar6 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)&str,(ulong)&url);
    std::__cxx11::string::operator=((string *)&fields,(string *)&str);
    std::__cxx11::string::~string((string *)&str);
    std::__cxx11::string::erase((ulong)&url,uVar6);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"InternalTest",(allocator<char> *)&fstr);
  cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&str);
  bVar2 = cmIsOn((cmValue)0x19c1eb);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"RetryDelay",(allocator<char> *)&fstr);
  psVar7 = (string *)
           cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&str);
  if (psVar7 == (string *)0x0) {
    psVar7 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&retryDelayString,(string *)psVar7);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"RetryCount",(allocator<char> *)&fstr);
  psVar7 = (string *)
           cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&str);
  if (psVar7 == (string *)0x0) {
    psVar7 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&retryCountString,(string *)psVar7);
  std::__cxx11::string::~string((string *)&str);
  if (retryDelayString._M_string_length == 0) {
LAB_0019c4e4:
    local_8c8 = 0;
  }
  else {
    retryDelayValue = 0;
    bVar3 = cmStrToULong(&retryDelayString,&retryDelayValue);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
      poVar8 = std::operator<<((ostream *)&str,"Invalid value for \'RETRY_DELAY\' : ");
      poVar8 = std::operator<<(poVar8,(string *)&retryDelayString);
      std::endl<char,std::char_traits<char>>(poVar8);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x218,_fstr,false);
      std::__cxx11::string::~string((string *)&fstr);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
      goto LAB_0019c4e4;
    }
    local_8c8 = retryDelayValue;
  }
  retryCount = 0;
  if ((retryCountString._M_string_length != 0) &&
     (bVar3 = cmStrToULong(&retryCountString,&retryCount), !bVar3)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    poVar8 = std::operator<<((ostream *)&str,"Invalid value for \'RETRY_DELAY\' : ");
    poVar8 = std::operator<<(poVar8,(string *)&retryCountString);
    std::endl<char,std::char_traits<char>>(poVar8);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x222,_fstr,false);
    std::__cxx11::string::~string((string *)&fstr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  }
  cmSystemTools::ComputeFileHash(&md5sum,file,AlgoMD5);
  pcVar9 = cmCTest::GetScriptHandler((this->super_cmCTestGenericHandler).CTest);
  this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
  super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
  super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
       (((pcVar9->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
         super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
         super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"SubProject",(allocator<char> *)&fstr);
  source = cmState::GetGlobalProperty
                     ((cmState *)
                      this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)&str);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  if (source.Value != (string *)0x0) {
    poVar8 = std::operator<<((ostream *)&str,"subproject=");
    cmCTestCurl::Escape((string *)&fstr,&curl,source.Value);
    poVar8 = std::operator<<(poVar8,(string *)&fstr);
    std::operator<<(poVar8,"&");
    std::__cxx11::string::~string((string *)&fstr);
  }
  std::chrono::_V2::system_clock::now();
  poVar8 = std::operator<<((ostream *)&str,"stamp=");
  cmCTest::GetCurrentTag_abi_cxx11_
            ((string *)&retryDelayValue,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape((string *)&fstr,&curl,(string *)&retryDelayValue);
  poVar8 = std::operator<<(poVar8,(string *)&fstr);
  poVar8 = std::operator<<(poVar8,"-");
  cmCTest::GetTestModelString_abi_cxx11_((string *)&json,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape((string *)&reader,&curl,(string *)&json);
  poVar8 = std::operator<<(poVar8,(string *)&reader);
  poVar8 = std::operator<<(poVar8,"&");
  poVar8 = std::operator<<(poVar8,"model=");
  cmCTest::GetTestModelString_abi_cxx11_(&upload_as,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape(&response,&curl,&upload_as);
  poVar8 = std::operator<<(poVar8,(string *)&response);
  poVar8 = std::operator<<(poVar8,"&");
  poVar8 = std::operator<<(poVar8,"build=");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"BuildName",&local_8c9);
  cmCTest::GetCTestConfiguration(&local_818,pcVar1,&local_160);
  cmCTestCurl::Escape(&local_8f8,&curl,&local_818);
  poVar8 = std::operator<<(poVar8,(string *)&local_8f8);
  poVar8 = std::operator<<(poVar8,"&");
  poVar8 = std::operator<<(poVar8,"site=");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"Site",&local_8ca);
  cmCTest::GetCTestConfiguration(&local_1a0,pcVar1,&local_1c0);
  cmCTestCurl::Escape(&local_180,&curl,&local_1a0);
  poVar8 = std::operator<<(poVar8,(string *)&local_180);
  poVar8 = std::operator<<(poVar8,"&");
  poVar8 = std::operator<<(poVar8,"group=");
  cmCTest::GetTestModelString_abi_cxx11_(&local_200,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape(&local_1e0,&curl,&local_200);
  poVar8 = std::operator<<(poVar8,(string *)&local_1e0);
  poVar8 = std::operator<<(poVar8,"&");
  poVar8 = std::operator<<(poVar8,"track=");
  cmCTest::GetTestModelString_abi_cxx11_(&local_240,(this->super_cmCTestGenericHandler).CTest);
  cmCTestCurl::Escape(&local_220,&curl,&local_240);
  poVar8 = std::operator<<(poVar8,(string *)&local_220);
  poVar8 = std::operator<<(poVar8,"&");
  poVar8 = std::operator<<(poVar8,"starttime=");
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  poVar8 = std::operator<<(poVar8,"&");
  poVar8 = std::operator<<(poVar8,"endtime=");
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  poVar8 = std::operator<<(poVar8,"&");
  poVar8 = std::operator<<(poVar8,"datafilesmd5[0]=");
  poVar8 = std::operator<<(poVar8,(string *)&md5sum);
  poVar8 = std::operator<<(poVar8,"&");
  poVar8 = std::operator<<(poVar8,"type=");
  cmCTestCurl::Escape(&local_260,&curl,typeString);
  std::operator<<(poVar8,(string *)&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&response);
  std::__cxx11::string::~string((string *)&upload_as);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&json);
  std::__cxx11::string::~string((string *)&fstr);
  std::__cxx11::string::~string((string *)&retryDelayValue);
  if (fields._M_string_length != 0) {
    std::__cxx11::string::push_back((char)&fields);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)&fields);
  std::__cxx11::string::~string((string *)&fstr);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fstr);
  poVar8 = std::operator<<((ostream *)&fstr,"fields: ");
  poVar8 = std::operator<<(poVar8,(string *)&fields);
  poVar8 = std::operator<<(poVar8,"\nurl:");
  poVar8 = std::operator<<(poVar8,(string *)&url);
  poVar8 = std::operator<<(poVar8,"\nfile: ");
  poVar8 = std::operator<<(poVar8,(string *)file);
  std::operator<<(poVar8,"\n");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
               ,0x24e,(char *)retryDelayValue,(this->super_cmCTestGenericHandler).Quiet);
  local_8d8 = this;
  std::__cxx11::string::~string((string *)&retryDelayValue);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fstr);
  response._M_dataplus._M_p = (pointer)&response.field_2;
  response._M_string_length = 0;
  response.field_2._M_local_buf[0] = '\0';
  bVar3 = cmCTestCurl::HttpRequest(&curl,&url,&fields,&response);
  if (bVar3 || bVar2) {
LAB_0019cdf5:
    if (bVar3 != false || bVar2) goto LAB_0019cdfe;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fstr);
    poVar8 = std::operator<<((ostream *)&fstr,"Error in HttpRequest\n");
    pcVar14 = local_8d8;
    std::operator<<(poVar8,(string *)&response);
    pcVar1 = (pcVar14->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x26d,(char *)retryDelayValue,false);
    std::__cxx11::string::~string((string *)&retryDelayValue);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fstr);
    iVar4 = -1;
  }
  else {
    lVar10 = local_8c8 * 1000000000;
    uVar6 = 0;
    do {
      if (retryCount <= uVar6) {
        bVar3 = false;
        goto LAB_0019cdf5;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fstr);
      poVar8 = std::operator<<((ostream *)&fstr,"   Request failed, waiting ");
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      std::operator<<(poVar8," seconds...\n");
      pcVar14 = local_8d8;
      pcVar1 = (local_8d8->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,600,(char *)retryDelayValue,(pcVar14->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&retryDelayValue);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fstr);
      lVar11 = std::chrono::_V2::steady_clock::now();
      while (lVar12 = std::chrono::_V2::steady_clock::now(), lVar12 < lVar11 + lVar10) {
        cmsys::SystemTools::Delay(100);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fstr);
      poVar8 = std::operator<<((ostream *)&fstr,"   Retry request: Attempt ");
      uVar6 = uVar6 + 1;
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8," of ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
      pcVar14 = local_8d8;
      pcVar1 = (local_8d8->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x262,(char *)retryDelayValue,(pcVar14->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&retryDelayValue);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fstr);
      bVar3 = cmCTestCurl::HttpRequest(&curl,&url,&fields,&response);
    } while (!bVar3);
LAB_0019cdfe:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fstr);
    poVar8 = std::operator<<((ostream *)&fstr,"Request upload response: [");
    pcVar14 = local_8d8;
    poVar8 = std::operator<<(poVar8,(string *)&response);
    std::operator<<(poVar8,"]\n");
    pcVar1 = (pcVar14->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x272,(char *)retryDelayValue,(pcVar14->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&retryDelayValue);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fstr);
    Json::Value::Value(&json,nullValue);
    Json::Reader::Reader(&reader);
    if (bVar2) {
LAB_0019cec6:
      cmsys::SystemTools::GetFilenameName(&upload_as,file);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fstr);
      poVar8 = std::operator<<((ostream *)&fstr,"type=");
      cmCTestCurl::Escape((string *)&retryDelayValue,&curl,typeString);
      poVar8 = std::operator<<(poVar8,(string *)&retryDelayValue);
      poVar8 = std::operator<<(poVar8,"&");
      poVar8 = std::operator<<(poVar8,"md5=");
      poVar8 = std::operator<<(poVar8,(string *)&md5sum);
      poVar8 = std::operator<<(poVar8,"&");
      poVar8 = std::operator<<(poVar8,"filename=");
      cmCTestCurl::Escape(&local_8f8,&curl,&upload_as);
      poVar8 = std::operator<<(poVar8,(string *)&local_8f8);
      poVar8 = std::operator<<(poVar8,"&");
      poVar8 = std::operator<<(poVar8,"buildid=");
      pVVar13 = Json::Value::operator[](&json,"buildid");
      Json::Value::asString_abi_cxx11_(&local_818,pVVar13);
      std::operator<<(poVar8,(string *)&local_818);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_8f8);
      std::__cxx11::string::~string((string *)&retryDelayValue);
      if (bVar2) {
        bVar3 = false;
LAB_0019d1dd:
        lVar10 = local_8c8 * 1000000000;
        uVar6 = 0;
        do {
          pcVar14 = local_8d8;
          if (retryCount <= uVar6) break;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&retryDelayValue);
          poVar8 = std::operator<<((ostream *)&retryDelayValue,"   Upload failed, waiting ");
          poVar8 = std::ostream::_M_insert<long>((long)poVar8);
          std::operator<<(poVar8," seconds...\n");
          pcVar14 = local_8d8;
          pcVar1 = (local_8d8->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x2a4,local_8f8._M_dataplus._M_p,
                       (pcVar14->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&local_8f8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&retryDelayValue);
          lVar11 = std::chrono::_V2::steady_clock::now();
          while (lVar12 = std::chrono::_V2::steady_clock::now(), lVar12 < lVar11 + lVar10) {
            cmsys::SystemTools::Delay(100);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&retryDelayValue);
          poVar8 = std::operator<<((ostream *)&retryDelayValue,"   Retry upload: Attempt ");
          uVar6 = uVar6 + 1;
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          poVar8 = std::operator<<(poVar8," of ");
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar14 = local_8d8;
          pcVar1 = (local_8d8->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x2ae,local_8f8._M_dataplus._M_p,
                       (pcVar14->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&local_8f8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&retryDelayValue);
          if (!bVar2) {
            std::__cxx11::stringbuf::str();
            bVar3 = cmCTestCurl::UploadFile(&curl,file,&url,(string *)&retryDelayValue,&response);
            std::__cxx11::string::~string((string *)&retryDelayValue);
          }
          pcVar14 = local_8d8;
        } while (bVar3 == false);
      }
      else {
        std::__cxx11::stringbuf::str();
        bVar3 = cmCTestCurl::UploadFile(&curl,file,&url,(string *)&retryDelayValue,&response);
        std::__cxx11::string::~string((string *)&retryDelayValue);
        if (!bVar3) goto LAB_0019d1dd;
      }
      if (bVar3 == false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&retryDelayValue);
        poVar8 = std::operator<<((ostream *)&retryDelayValue,"error uploading to CDash. ");
        poVar8 = std::operator<<(poVar8,(string *)file);
        poVar8 = std::operator<<(poVar8," ");
        poVar8 = std::operator<<(poVar8,(string *)&url);
        poVar8 = std::operator<<(poVar8," ");
        std::__cxx11::stringbuf::str();
        std::operator<<(poVar8,(string *)&local_8f8);
        std::__cxx11::string::~string((string *)&local_8f8);
        pcVar1 = (pcVar14->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,700,local_8f8._M_dataplus._M_p,false);
LAB_0019d6a0:
        std::__cxx11::string::~string((string *)&local_8f8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&retryDelayValue);
        iVar4 = -1;
      }
      else {
        bVar2 = Json::Reader::parse(&reader,&response,&json,true);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&retryDelayValue);
          poVar8 = std::operator<<((ostream *)&retryDelayValue,"error parsing json string [");
          poVar8 = std::operator<<(poVar8,(string *)&response);
          poVar8 = std::operator<<(poVar8,"]\n");
          Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_8f8,&reader);
          poVar8 = std::operator<<(poVar8,(string *)&local_8f8);
          std::operator<<(poVar8,"\n");
          std::__cxx11::string::~string((string *)&local_8f8);
          pcVar1 = (pcVar14->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x2c3,local_8f8._M_dataplus._M_p,false);
          goto LAB_0019d6a0;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&retryDelayValue);
        poVar8 = std::operator<<((ostream *)&retryDelayValue,"Upload file response: [");
        poVar8 = std::operator<<(poVar8,(string *)&response);
        std::operator<<(poVar8,"]\n");
        pcVar1 = (pcVar14->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x2c8,local_8f8._M_dataplus._M_p,(pcVar14->super_cmCTestGenericHandler).Quiet)
        ;
        std::__cxx11::string::~string((string *)&local_8f8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&retryDelayValue);
        iVar4 = 0;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fstr);
      std::__cxx11::string::~string((string *)&upload_as);
    }
    else {
      bVar3 = Json::Reader::parse(&reader,&response,&json,true);
      if (bVar3) {
        pVVar13 = Json::Value::operator[](&json,"status");
        IVar5 = Json::Value::asInt(pVVar13);
        if (IVar5 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fstr);
          poVar8 = std::operator<<((ostream *)&fstr,"Bad status returned from CDash: ");
          pVVar13 = Json::Value::operator[](&json,"status");
          IVar5 = Json::Value::asInt(pVVar13);
          std::ostream::operator<<(poVar8,IVar5);
          pcVar1 = (pcVar14->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x27e,(char *)retryDelayValue,false);
          goto LAB_0019d5d1;
        }
        pVVar13 = Json::Value::operator[](&json,"datafilesmd5");
        bVar3 = Json::Value::isArray(pVVar13);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fstr);
          poVar8 = std::operator<<((ostream *)&fstr,"bad datafilesmd5 value in response ");
          poVar8 = std::operator<<(poVar8,(string *)&response);
          std::operator<<(poVar8,"\n");
          pcVar1 = (pcVar14->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x28d,(char *)retryDelayValue,false);
          goto LAB_0019d5d1;
        }
        pVVar13 = Json::Value::operator[](&json,"datafilesmd5");
        pVVar13 = Json::Value::operator[](pVVar13,0);
        IVar5 = Json::Value::asInt(pVVar13);
        if (IVar5 != 1) goto LAB_0019cec6;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fstr);
        poVar8 = std::operator<<((ostream *)&fstr,"File already exists on CDash, skip upload ");
        poVar8 = std::operator<<(poVar8,(string *)file);
        std::operator<<(poVar8,"\n");
        pcVar1 = (pcVar14->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x288,(char *)retryDelayValue,(pcVar14->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&retryDelayValue);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fstr);
        iVar4 = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fstr);
        poVar8 = std::operator<<((ostream *)&fstr,"error parsing json string [");
        poVar8 = std::operator<<(poVar8,(string *)&response);
        poVar8 = std::operator<<(poVar8,"]\n");
        Json::Reader::getFormattedErrorMessages_abi_cxx11_((String *)&retryDelayValue,&reader);
        poVar8 = std::operator<<(poVar8,(string *)&retryDelayValue);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&retryDelayValue);
        pcVar1 = (pcVar14->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x279,(char *)retryDelayValue,false);
LAB_0019d5d1:
        std::__cxx11::string::~string((string *)&retryDelayValue);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fstr);
        iVar4 = -1;
      }
    }
    Json::Reader::~Reader(&reader);
    Json::Value::~Value(&json);
  }
  std::__cxx11::string::~string((string *)&response);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  std::__cxx11::string::~string((string *)&md5sum);
  std::__cxx11::string::~string((string *)&retryCountString);
  std::__cxx11::string::~string((string *)&retryDelayString);
  std::__cxx11::string::~string((string *)&fields);
LAB_0019d739:
  std::__cxx11::string::~string((string *)&url);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  std::__cxx11::string::~string((string *)&curlopt);
  cmCTestCurl::~cmCTestCurl(&curl);
  return iVar4;
}

Assistant:

int cmCTestSubmitHandler::HandleCDashUploadFile(std::string const& file,
                                                std::string const& typeString)
{
  if (file.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Upload file not specified\n");
    return -1;
  }
  if (!cmSystemTools::FileExists(file)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Upload file not found: '" << file << "'\n");
    return -1;
  }
  cmCTestCurl curl(this->CTest);
  curl.SetQuiet(this->Quiet);
  std::string curlopt(this->CTest->GetCTestConfiguration("CurlOptions"));
  std::vector<std::string> args = cmExpandedList(curlopt);
  curl.SetCurlOptions(args);
  auto submitInactivityTimeout = this->GetSubmitInactivityTimeout();
  if (submitInactivityTimeout != 0) {
    curl.SetTimeOutSeconds(submitInactivityTimeout);
  }
  curl.SetHttpHeaders(this->HttpHeaders);
  std::string url = this->CTest->GetSubmitURL();
  if (!cmHasLiteralPrefix(url, "http://") &&
      !cmHasLiteralPrefix(url, "https://")) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Only http and https are supported for CDASH_UPLOAD\n");
    return -1;
  }

  std::string fields;
  std::string::size_type pos = url.find('?');
  if (pos != std::string::npos) {
    fields = url.substr(pos + 1);
    url.erase(pos);
  }
  bool internalTest = cmIsOn(this->GetOption("InternalTest"));

  // Get RETRY_COUNT and RETRY_DELAY values if they were set.
  std::string retryDelayString = *this->GetOption("RetryDelay");
  std::string retryCountString = *this->GetOption("RetryCount");
  auto retryDelay = std::chrono::seconds(0);
  if (!retryDelayString.empty()) {
    unsigned long retryDelayValue = 0;
    if (!cmStrToULong(retryDelayString, &retryDelayValue)) {
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'RETRY_DELAY' : " << retryDelayString
                                                      << std::endl);
    } else {
      retryDelay = std::chrono::seconds(retryDelayValue);
    }
  }
  unsigned long retryCount = 0;
  if (!retryCountString.empty()) {
    if (!cmStrToULong(retryCountString, &retryCount)) {
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'RETRY_DELAY' : " << retryCountString
                                                      << std::endl);
    }
  }

  std::string md5sum =
    cmSystemTools::ComputeFileHash(file, cmCryptoHash::AlgoMD5);
  // 1. request the buildid and check to see if the file
  //    has already been uploaded
  // TODO I added support for subproject. You would need to add
  // a "&subproject=subprojectname" to the first POST.
  cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
  cmake* cm = ch->GetCMake();
  cmValue subproject = cm->GetState()->GetGlobalProperty("SubProject");
  // TODO: Encode values for a URL instead of trusting caller.
  std::ostringstream str;
  if (subproject) {
    str << "subproject=" << curl.Escape(*subproject) << "&";
  }
  auto timeNow =
    std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
  str << "stamp=" << curl.Escape(this->CTest->GetCurrentTag()) << "-"
      << curl.Escape(this->CTest->GetTestModelString()) << "&"
      << "model=" << curl.Escape(this->CTest->GetTestModelString()) << "&"
      << "build="
      << curl.Escape(this->CTest->GetCTestConfiguration("BuildName")) << "&"
      << "site=" << curl.Escape(this->CTest->GetCTestConfiguration("Site"))
      << "&"
      << "group=" << curl.Escape(this->CTest->GetTestModelString())
      << "&"
      // For now, we send both "track" and "group" to CDash in case we're
      // submitting to an older instance that still expects the prior
      // terminology.
      << "track=" << curl.Escape(this->CTest->GetTestModelString()) << "&"
      << "starttime=" << timeNow << "&"
      << "endtime=" << timeNow << "&"
      << "datafilesmd5[0]=" << md5sum << "&"
      << "type=" << curl.Escape(typeString);
  if (!fields.empty()) {
    fields += '&';
  }
  fields += str.str();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "fields: " << fields << "\nurl:" << url
                                << "\nfile: " << file << "\n",
                     this->Quiet);
  std::string response;

  bool requestSucceeded = curl.HttpRequest(url, fields, response);
  if (!internalTest && !requestSucceeded) {
    // If request failed, wait and retry.
    for (unsigned long i = 0; i < retryCount; i++) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Request failed, waiting " << retryDelay.count()
                                                       << " seconds...\n",
                         this->Quiet);

      auto stop = std::chrono::steady_clock::now() + retryDelay;
      while (std::chrono::steady_clock::now() < stop) {
        cmSystemTools::Delay(100);
      }

      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Retry request: Attempt "
                           << (i + 1) << " of " << retryCount << std::endl,
                         this->Quiet);

      requestSucceeded = curl.HttpRequest(url, fields, response);
      if (requestSucceeded) {
        break;
      }
    }
  }
  if (!internalTest && !requestSucceeded) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error in HttpRequest\n"
                 << response);
    return -1;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Request upload response: [" << response << "]\n",
                     this->Quiet);
  Json::Value json;
  Json::Reader reader;
  if (!internalTest && !reader.parse(response, json)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "error parsing json string ["
                 << response << "]\n"
                 << reader.getFormattedErrorMessages() << "\n");
    return -1;
  }
  if (!internalTest && json["status"].asInt() != 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Bad status returned from CDash: " << json["status"].asInt());
    return -1;
  }
  if (!internalTest) {
    if (json["datafilesmd5"].isArray()) {
      int datares = json["datafilesmd5"][0].asInt();
      if (datares == 1) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "File already exists on CDash, skip upload "
                             << file << "\n",
                           this->Quiet);
        return 0;
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "bad datafilesmd5 value in response " << response << "\n");
      return -1;
    }
  }

  std::string upload_as = cmSystemTools::GetFilenameName(file);
  std::ostringstream fstr;
  fstr << "type=" << curl.Escape(typeString) << "&"
       << "md5=" << md5sum << "&"
       << "filename=" << curl.Escape(upload_as) << "&"
       << "buildid=" << json["buildid"].asString();

  bool uploadSucceeded = false;
  if (!internalTest) {
    uploadSucceeded = curl.UploadFile(file, url, fstr.str(), response);
  }

  if (!uploadSucceeded) {
    // If upload failed, wait and retry.
    for (unsigned long i = 0; i < retryCount; i++) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Upload failed, waiting " << retryDelay.count()
                                                      << " seconds...\n",
                         this->Quiet);

      auto stop = std::chrono::steady_clock::now() + retryDelay;
      while (std::chrono::steady_clock::now() < stop) {
        cmSystemTools::Delay(100);
      }

      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Retry upload: Attempt "
                           << (i + 1) << " of " << retryCount << std::endl,
                         this->Quiet);

      if (!internalTest) {
        uploadSucceeded = curl.UploadFile(file, url, fstr.str(), response);
      }
      if (uploadSucceeded) {
        break;
      }
    }
  }

  if (!uploadSucceeded) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "error uploading to CDash. " << file << " " << url << " "
                                            << fstr.str());
    return -1;
  }
  if (!reader.parse(response, json)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "error parsing json string ["
                 << response << "]\n"
                 << reader.getFormattedErrorMessages() << "\n");
    return -1;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Upload file response: [" << response << "]\n",
                     this->Quiet);
  return 0;
}